

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownimporter.cpp
# Opt level: O0

int __thiscall
QTextMarkdownImporter::cbLeaveSpan(QTextMarkdownImporter *this,int spanType,void *detail)

{
  bool bVar1;
  int in_ESI;
  QDebug *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QTextCharFormat charFmt;
  QLoggingCategory *in_stack_ffffffffffffff18;
  int t;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_ffffffffffffff20;
  QFont *in_stack_ffffffffffffff28;
  QColor *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff68;
  QDebug local_50 [3];
  undefined1 *local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)0x9ff9bf);
  bVar1 = QList<QTextCharFormat>::isEmpty((QList<QTextCharFormat> *)0x9ff9cd);
  if (!bVar1) {
    QStack<QTextCharFormat>::pop((QStack<QTextCharFormat> *)in_stack_ffffffffffffff18);
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x9ff9f4);
    bVar1 = QList<QTextCharFormat>::isEmpty((QList<QTextCharFormat> *)0x9ffa02);
    if (!bVar1) {
      QStack<QTextCharFormat>::top((QStack<QTextCharFormat> *)0x9ffa14);
      QTextCharFormat::operator=
                ((QTextCharFormat *)in_stack_ffffffffffffff20,
                 (QTextCharFormat *)in_stack_ffffffffffffff18);
    }
  }
  QTextCursor::setCharFormat
            ((QTextCursor *)in_stack_ffffffffffffff30,(QTextCharFormat *)in_stack_ffffffffffffff28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = 0xaa;
  uStack_2f = 0xaaaaaaaaaaaaaa;
  lcMD();
  anon_unknown.dwarf_1ad096f::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_38), bVar1) {
    anon_unknown.dwarf_1ad096f::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x9ffa8e);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,
               (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),(char *)in_stack_ffffffffffffff18,
               (char *)0x9ffaa4);
    t = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    QMessageLogger::debug();
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff20,t);
    in_stack_ffffffffffffff18 =
         (QLoggingCategory *)QDebug::operator<<(in_RDI,in_stack_ffffffffffffff68);
    QTextCharFormat::font((QTextCharFormat *)in_stack_ffffffffffffff28);
    QFont::families(in_stack_ffffffffffffff28);
    QList<QString>::constFirst((QList<QString> *)in_stack_ffffffffffffff20);
    in_stack_ffffffffffffff20 =
         (QLoggingCategoryMacroHolder<(QtMsgType)0> *)
         QDebug::operator<<((QDebug *)in_stack_ffffffffffffff30,(QString *)in_stack_ffffffffffffff28
                           );
    QTextCharFormat::fontWeight((QTextCharFormat *)in_stack_ffffffffffffff20);
    in_stack_ffffffffffffff28 =
         (QFont *)QDebug::operator<<((QDebug *)in_stack_ffffffffffffff20,
                                     (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    QTextCharFormat::fontItalic((QTextCharFormat *)0x9ffb47);
    in_stack_ffffffffffffff30 = (QColor *)QDebug::operator<<(in_RDI,in_stack_ffffffffffffff68);
    QTextFormat::foreground((QTextFormat *)in_stack_ffffffffffffff18);
    QBrush::color((QBrush *)0x9ffb89);
    QColor::name(in_stack_ffffffffffffff30,(NameFormat)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff30,(QString *)in_stack_ffffffffffffff28);
    QString::~QString((QString *)0x9ffbb1);
    QBrush::~QBrush((QBrush *)0x9ffbbb);
    QList<QString>::~QList((QList<QString> *)0x9ffbc5);
    QFont::~QFont((QFont *)0x9ffbd2);
    QDebug::~QDebug(local_50);
    local_30 = 0;
  }
  if (in_ESI == 3) {
    *(undefined1 *)&in_RDI[0x1f].stream = 0;
  }
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x9ffc0c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int QTextMarkdownImporter::cbLeaveSpan(int spanType, void *detail)
{
    Q_UNUSED(detail);
    QTextCharFormat charFmt;
    if (!m_spanFormatStack.isEmpty()) {
        m_spanFormatStack.pop();
        if (!m_spanFormatStack.isEmpty())
            charFmt = m_spanFormatStack.top();
    }
    m_cursor.setCharFormat(charFmt);
    qCDebug(lcMD) << spanType << "setCharFormat" << charFmt.font().families().constFirst()
                  << charFmt.fontWeight() << (charFmt.fontItalic() ? "italic" : "")
                  << charFmt.foreground().color().name();
    if (spanType == int(MD_SPAN_IMG))
        m_imageSpan = false;
    return 0; // no error
}